

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

QFontMetrics __thiscall QPainter::fontMetrics(QPainter *this)

{
  long *in_RSI;
  long in_FS_OFFSET;
  undefined1 local_38 [20];
  undefined4 local_24;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*in_RSI + 0x118) == 0) {
    local_38._0_4_ = 2;
    local_24 = 0;
    local_38._4_8_ = 0;
    local_38._12_8_ = 0;
    local_20 = "default";
    QMessageLogger::warning(local_38,"QPainter::fontMetrics: Painter not active");
    QFont::QFont((QFont *)local_38);
    QFontMetrics::QFontMetrics((QFontMetrics *)this,(QFont *)local_38);
    QFont::~QFont((QFont *)local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00385219;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00385219:
      __stack_chk_fail();
    }
    QFontMetrics::QFontMetrics((QFontMetrics *)this,(QFont *)(*(long *)(*in_RSI + 0x40) + 0x20));
  }
  return (QExplicitlySharedDataPointer<QFontPrivate>)
         (QExplicitlySharedDataPointer<QFontPrivate>)this;
}

Assistant:

QFontMetrics QPainter::fontMetrics() const
{
    Q_D(const QPainter);
    if (!d->engine) {
        qWarning("QPainter::fontMetrics: Painter not active");
        return QFontMetrics(QFont());
    }
    return QFontMetrics(d->state->font);
}